

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_return.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::dispatch::detail::
Handle_Return<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>::
handle<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>,void>
          (Handle_Return<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>> *this,
          pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value> *r)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar4;
  Boxed_Value BVar5;
  shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>_> local_20;
  
  local_20.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x30);
  (local_20.
   super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_use_count = 1;
  (local_20.
   super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_M_weak_count = 1;
  (local_20.
   super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
   ._M_refcount._M_pi)->_vptr__Sp_counted_base =
       (_func_int **)&PTR___Sp_counted_ptr_inplace_003d1650;
  local_20.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            (local_20.
             super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi + 1);
  peVar1 = (r->first).m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (r->first).m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (r->first).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_20.
    super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[1]._M_use_count = p_Var2;
  (r->first).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  peVar1 = (r->second).m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (r->second).m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
  (r->second).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_20.
  super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi[2]._vptr__Sp_counted_base = (_func_int **)peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
   &local_20.
    super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi[2]._M_use_count = p_Var2;
  (r->second).m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  sVar4 = Boxed_Value::Object_Data::get<std::pair<chaiscript::Boxed_Value,chaiscript::Boxed_Value>>
                    ((Object_Data *)this,&local_20,true);
  _Var3 = sVar4.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_20.
      super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<std::pair<chaiscript::Boxed_Value,_chaiscript::Boxed_Value>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
    _Var3._M_pi = extraout_RDX;
  }
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value handle(T &&r) {
          return Boxed_Value(std::make_shared<T>(std::forward<T>(r)), true);
        }